

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<IOVariable,_8UL>::push_back
          (SmallVector<IOVariable,_8UL> *this,IOVariable *t)

{
  size_t *psVar1;
  undefined8 *puVar2;
  char *pcVar3;
  size_t sVar4;
  IOVariable *pIVar5;
  undefined8 uVar6;
  undefined7 uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  ulong uVar10;
  IOVariable *pIVar11;
  long lVar12;
  size_t i;
  ulong uVar13;
  ulong uVar14;
  
  sVar4 = (this->super_VectorView<IOVariable>).buffer_size;
  uVar14 = sVar4 + 1;
  if (uVar14 < 0xaaaaaaaaaaaaaab) {
    uVar13 = this->buffer_capacity;
    if (uVar13 < uVar14) {
      uVar10 = 8;
      if (8 < uVar13) {
        uVar10 = uVar13;
      }
      do {
        uVar13 = uVar10;
        uVar10 = uVar13 * 2;
      } while (uVar13 < uVar14);
      if (uVar13 < 9) {
        pIVar11 = (IOVariable *)&this->stack_storage;
      }
      else {
        pIVar11 = (IOVariable *)malloc(uVar13 * 0x18);
      }
      if (pIVar11 == (IOVariable *)0x0) goto LAB_0024f77d;
      if ((sVar4 != 0) && (pIVar11 != (this->super_VectorView<IOVariable>).ptr)) {
        lVar12 = 0;
        uVar14 = 0;
        do {
          pIVar5 = (this->super_VectorView<IOVariable>).ptr;
          *(undefined8 *)(&pIVar11->block + lVar12) = *(undefined8 *)(&pIVar5->block + lVar12);
          puVar2 = (undefined8 *)((long)&pIVar5->var + lVar12);
          uVar6 = puVar2[1];
          pcVar3 = (char *)((long)&pIVar11->var + lVar12);
          *(undefined8 *)pcVar3 = *puVar2;
          *(undefined8 *)(pcVar3 + 8) = uVar6;
          uVar14 = uVar14 + 1;
          lVar12 = lVar12 + 0x18;
        } while (uVar14 < (this->super_VectorView<IOVariable>).buffer_size);
      }
      pIVar5 = (this->super_VectorView<IOVariable>).ptr;
      if (pIVar5 != (IOVariable *)&this->stack_storage) {
        free(pIVar5);
      }
      (this->super_VectorView<IOVariable>).ptr = pIVar11;
      this->buffer_capacity = uVar13;
    }
    pIVar11 = (this->super_VectorView<IOVariable>).ptr;
    sVar4 = (this->super_VectorView<IOVariable>).buffer_size;
    uVar7 = *(undefined7 *)&t->field_0x11;
    pIVar5 = pIVar11 + sVar4;
    pIVar5->block = t->block;
    *(undefined7 *)&pIVar5->field_0x11 = uVar7;
    uVar8 = t->location;
    uVar9 = t->block_member_index;
    pIVar11 = pIVar11 + sVar4;
    pIVar11->var = t->var;
    pIVar11->location = uVar8;
    pIVar11->block_member_index = uVar9;
    psVar1 = &(this->super_VectorView<IOVariable>).buffer_size;
    *psVar1 = *psVar1 + 1;
    return;
  }
LAB_0024f77d:
  ::std::terminate();
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}